

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O1

void e2e_fdb_set_person(storage_t *st,person_t *p)

{
  int *piVar1;
  btree_blk_ops **ppbVar2;
  void **ppvVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  btree *pbVar6;
  __atomic_base<unsigned_long> __s2;
  fdb_file_handle *pfVar7;
  bool bVar8;
  fdb_status fVar9;
  fdb_status fVar10;
  int iVar11;
  size_t sVar12;
  checkpoint_t *pcVar13;
  __atomic_base<unsigned_long> __s;
  fdb_seqnum_t fVar14;
  char *__s1;
  undefined4 uVar15;
  person_t *p_00;
  fdb_doc *pfVar16;
  checkpoint_t *pcVar17;
  char *pcVar18;
  fdb_kvs_handle **ptr_handle;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle *pfVar20;
  fdb_file_handle *fhandle;
  char *unaff_R12;
  char *handle;
  fdb_kvs_handle *unaff_R13;
  long lVar21;
  fdb_file_handle **ppfVar22;
  list *doc_00;
  fdb_doc *doc;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_460;
  uint64_t uStackY_458;
  fdb_kvs_handle **ppfStackY_450;
  fdb_kvs_handle *pfStackY_448;
  list *plStackY_440;
  fdb_file_handle **ppfStackY_430;
  fdb_file_handle *pfStackY_428;
  undefined8 uStackY_420;
  fdb_file_handle **ppfStackY_418;
  timeval tStackY_410;
  checkpoint_t *pcStackY_400;
  checkpoint_t *pcStackY_3f8;
  fdb_kvs_handle *pfStackY_3f0;
  fdb_kvs_handle *pfStackY_3e8;
  list *plStackY_3e0;
  code *pcStackY_3d8;
  fdb_doc *pfStack_3c8;
  fdb_iterator *pfStack_3c0;
  fdb_kvs_handle *pfStack_3b8;
  idx_prams_t iStack_3b0;
  timeval tStack_398;
  fdb_kvs_handle *pfStack_388;
  checkpoint_t *pcStack_380;
  checkpoint_t *pcStack_378;
  list *plStack_370;
  fdb_doc *pfStack_360;
  timeval tStack_358;
  undefined1 auStack_348 [48];
  char acStack_318 [264];
  fdb_kvs_handle *pfStack_210;
  checkpoint_t *pcStack_208;
  undefined1 auStack_1f8 [24];
  atomic<unsigned_long> aStack_1e0;
  fdb_kvs_handle *pfStack_1d8;
  atomic<unsigned_long> aStack_1d0;
  snap_handle *psStack_1b8;
  snap_handle *psStack_1b0;
  snap_handle *psStack_1a8;
  char acStack_19c [4];
  fdb_kvs_handle *pfStack_198;
  fdb_kvs_handle *pfStack_190;
  fdb_kvs_handle *pfStack_188;
  checkpoint_t *pcStack_180;
  snap_handle *psStack_178;
  timeval tStack_170;
  fdb_kvs_info fStack_160;
  checkpoint_t *pcStack_130;
  checkpoint_t *pcStack_128;
  fdb_kvs_handle *pfStack_120;
  checkpoint_t *pcStack_118;
  char *pcStack_110;
  code *pcStack_108;
  fdb_doc *pfStack_f8;
  timeval tStack_f0;
  void *pvStack_e0;
  checkpoint_t *pcStack_d8;
  char *pcStack_d0;
  timeval tStack_c0;
  fdb_kvs_handle *pfStack_b0;
  person_t *ppStack_a8;
  fdb_doc *pfStack_98;
  timeval tStack_90;
  storage_t *psStack_80;
  char *pcStack_78;
  person_t *ppStack_70;
  fdb_kvs_handle *pfStack_68;
  code *pcStack_60;
  person_t *local_48;
  timeval local_40;
  
  pcStack_60 = (code *)0x109599;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  pfVar20 = (fdb_kvs_handle *)&local_48;
  local_48 = (person_t *)0x0;
  pcStack_60 = (code *)0x1095b5;
  strcpy(p->keyspace,st->keyspace);
  pcStack_60 = (code *)0x1095bd;
  sVar12 = strlen(p->key);
  pcStack_60 = (code *)0x1095db;
  fdb_doc_create((fdb_doc **)pfVar20,p,sVar12,(void *)0x0,0,p,0xe0c);
  pcStack_60 = (code *)0x1095e7;
  fVar9 = fdb_get(st->all_docs,(fdb_doc *)local_48);
  pfVar19 = st->all_docs;
  pcStack_60 = (code *)0x1095f5;
  p_00 = local_48;
  fVar10 = fdb_set(pfVar19,(fdb_doc *)local_48);
  if (fVar10 == FDB_RESULT_SUCCESS) {
    pfVar20 = st->index1;
    unaff_R12 = p->name;
    pcStack_60 = (code *)0x109610;
    sVar12 = strlen(unaff_R12);
    pcStack_60 = (code *)0x10962a;
    p_00 = (person_t *)unaff_R12;
    pfVar19 = pfVar20;
    fVar10 = fdb_set_kv(pfVar20,unaff_R12,sVar12,*(void **)(local_48->key + 0x20),
                        *(size_t *)local_48->key);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00109710;
    unaff_R13 = st->index2;
    pcStack_60 = (code *)0x10963e;
    sVar12 = strlen(unaff_R12);
    pfVar20 = (fdb_kvs_handle *)&p->age;
    pcStack_60 = (code *)0x10965c;
    p_00 = (person_t *)unaff_R12;
    pfVar19 = unaff_R13;
    fVar10 = fdb_set_kv(unaff_R13,unaff_R12,sVar12,pfVar20,4);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_00109715;
    pcStack_60 = (code *)0x10967d;
    save_tx(st,*(void **)(local_48->key + 0x20),*(size_t *)local_48->key,1);
    if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_001096f2;
    pcStack_60 = (code *)0x10968d;
    bVar8 = is_indexed(st->index_params,p);
    if (!bVar8) {
LAB_001096e8:
      piVar1 = &st->v_chk->ndocs;
      *piVar1 = *piVar1 + 1;
LAB_001096f2:
      pcStack_60 = (code *)0x1096fc;
      fdb_doc_free((fdb_doc *)local_48);
      return;
    }
    pcVar13 = st->v_chk;
    uVar4 = pcVar13->num_indexed;
    uVar5 = pcVar13->sum_age_indexed;
    iVar11 = *(int *)pfVar20;
    pcVar13->num_indexed = uVar4 + 1;
    pcVar13->sum_age_indexed = iVar11 + uVar5;
    pcStack_60 = (code *)0x1096c8;
    free(*(void **)(local_48->key + 0x40));
    local_48->key[0x40] = '\0';
    local_48->key[0x41] = '\0';
    local_48->key[0x42] = '\0';
    local_48->key[0x43] = '\0';
    local_48->key[0x44] = '\0';
    local_48->key[0x45] = '\0';
    local_48->key[0x46] = '\0';
    local_48->key[0x47] = '\0';
    if (st->verify_set != true) goto LAB_001096e8;
    pfVar19 = st->all_docs;
    pcStack_60 = (code *)0x1096e4;
    p_00 = local_48;
    fVar10 = fdb_get(pfVar19,(fdb_doc *)local_48);
    if (fVar10 == FDB_RESULT_SUCCESS) goto LAB_001096e8;
  }
  else {
    pcStack_60 = (code *)0x109710;
    e2e_fdb_set_person_cold_1();
LAB_00109710:
    pcStack_60 = (code *)0x109715;
    e2e_fdb_set_person_cold_2();
LAB_00109715:
    pcStack_60 = (code *)0x10971a;
    e2e_fdb_set_person_cold_3();
  }
  pcStack_60 = e2e_fdb_del_person;
  e2e_fdb_set_person_cold_4();
  handle = (char *)0x0;
  ppStack_a8 = (person_t *)0x109740;
  psStack_80 = st;
  pcStack_78 = unaff_R12;
  ppStack_70 = p;
  pfStack_68 = pfVar20;
  pcStack_60 = (code *)(ulong)(uint)fVar9;
  gettimeofday(&tStack_90,(__timezone_ptr_t)0x0);
  pcVar18 = (char *)&pfStack_98;
  pfStack_98 = (fdb_doc *)0x0;
  ppStack_a8 = (person_t *)0x109750;
  sVar12 = strlen(p_00->key);
  ppStack_a8 = (person_t *)0x10976a;
  fdb_doc_create((fdb_doc **)pcVar18,p_00,sVar12,(void *)0x0,0,(void *)0x0,0);
  ppStack_a8 = (person_t *)0x109776;
  fVar9 = fdb_get((fdb_kvs_handle *)(pfVar19->kvs_config).custom_cmp,pfStack_98);
  __s1 = (char *)(ulong)(uint)fVar9;
  pcVar13 = (checkpoint_t *)(pfVar19->kvs_config).custom_cmp;
  ppStack_a8 = (person_t *)0x109784;
  pfVar16 = pfStack_98;
  fVar10 = fdb_del((fdb_kvs_handle *)pcVar13,pfStack_98);
  if (fVar10 == FDB_RESULT_SUCCESS) {
    handle = (char *)(pfVar19->kvs_config).custom_cmp_param;
    pcVar18 = p_00->name;
    ppStack_a8 = (person_t *)0x10979f;
    sVar12 = strlen(pcVar18);
    ppStack_a8 = (person_t *)0x1097ad;
    pfVar16 = (fdb_doc *)pcVar18;
    pcVar13 = (checkpoint_t *)handle;
    fVar10 = fdb_del_kv((fdb_kvs_handle *)handle,pcVar18,sVar12);
    if (fVar10 != FDB_RESULT_SUCCESS) goto LAB_0010983d;
    handle = (char *)pfVar19->kvs;
    ppStack_a8 = (person_t *)0x1097c1;
    sVar12 = strlen(pcVar18);
    ppStack_a8 = (person_t *)0x1097cf;
    pfVar16 = (fdb_doc *)pcVar18;
    pcVar13 = (checkpoint_t *)handle;
    fVar10 = fdb_del_kv((fdb_kvs_handle *)handle,pcVar18,sVar12);
    if (fVar10 == FDB_RESULT_SUCCESS) {
      ppStack_a8 = (person_t *)0x1097ec;
      save_tx((storage_t *)pfVar19,pfStack_98->key,pfStack_98->keylen,2);
      if (fVar9 == FDB_RESULT_SUCCESS) {
        ppStack_a8 = (person_t *)0x1097fc;
        bVar8 = is_indexed((idx_prams_t *)(pfVar19->field_6).seqtree,p_00);
        if (bVar8) {
          pbVar6 = pfVar19->staletree;
          piVar1 = (int *)((long)&pbVar6[0x12].blk_handle + 4);
          *piVar1 = *piVar1 + -1;
          ppbVar2 = &pbVar6[0x12].blk_ops;
          *(int *)ppbVar2 = *(int *)ppbVar2 - p_00->age;
        }
        ppvVar3 = &pfVar19->staletree[0x12].blk_handle;
        *(int *)ppvVar3 = *(int *)ppvVar3 + -1;
      }
      ppStack_a8 = (person_t *)0x10982b;
      fdb_doc_free(pfStack_98);
      return;
    }
  }
  else {
    ppStack_a8 = (person_t *)0x10983d;
    e2e_fdb_del_person_cold_1();
LAB_0010983d:
    ppStack_a8 = (person_t *)0x109842;
    e2e_fdb_del_person_cold_2();
  }
  ppStack_a8 = (person_t *)e2e_fdb_commit;
  e2e_fdb_del_person_cold_3();
  pcStack_d0 = (char *)0x10985f;
  pfStack_b0 = pfVar19;
  ppStack_a8 = p_00;
  gettimeofday(&tStack_c0,(__timezone_ptr_t)0x0);
  pcStack_d0 = (char *)0x109869;
  pcVar17 = pcVar13;
  fVar9 = fdb_commit((fdb_file_handle *)pcVar13,(fdb_commit_opt_t)pfVar16);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    return;
  }
  pcStack_d0 = (char *)start_checkpoint;
  e2e_fdb_commit_cold_1();
  pcStack_108 = (code *)0x109892;
  pvStack_e0 = (void *)((ulong)pfVar16 & 0xffffffff);
  pcStack_d8 = pcVar13;
  pcStack_d0 = pcVar18;
  gettimeofday(&tStack_f0,(__timezone_ptr_t)0x0);
  pfStack_f8 = (fdb_doc *)0x0;
  pfVar20 = *(fdb_kvs_handle **)((long)((fdb_kvs_config *)pcVar17->key + 1) + 8);
  uVar15._0_1_ = '\x02';
  uVar15._1_1_ = '\0';
  uVar15._2_1_ = '\0';
  uVar15._3_1_ = '\0';
  pcStack_108 = (code *)0x1098a9;
  fVar9 = fdb_begin_transaction((fdb_file_handle *)pfVar20,'\x02');
  if (fVar9 == FDB_RESULT_SUCCESS) {
    pcStack_108 = (code *)0x1098ba;
    pcVar13 = create_checkpoint((storage_t *)pcVar17,5);
    pcStack_108 = (code *)0x1098c5;
    sVar12 = strlen(pcVar13->key);
    pcVar18 = (char *)&pfStack_f8;
    pcStack_108 = (code *)0x1098e8;
    fdb_doc_create((fdb_doc **)pcVar18,pcVar13,sVar12,(void *)0x0,0,pcVar13,0x430);
    pcStack_108 = (code *)0x1098ff;
    save_tx((storage_t *)pcVar17,pfStack_f8->key,pfStack_f8->keylen,5);
    pfVar20 = *(fdb_kvs_handle **)((fdb_kvs_config *)pcVar17->key + 2);
    pcStack_108 = (code *)0x10990b;
    pfVar16 = pfStack_f8;
    fVar9 = fdb_set(pfVar20,pfStack_f8);
    uVar15 = SUB84(pfVar16,0);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      pcStack_108 = (code *)0x109917;
      free(pcVar13);
      pcStack_108 = (code *)0x109921;
      fdb_doc_free(pfStack_f8);
      return;
    }
  }
  else {
    pcStack_108 = (code *)0x109930;
    start_checkpoint_cold_1();
  }
  pcStack_108 = create_checkpoint;
  start_checkpoint_cold_2();
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x10995b;
  acStack_19c = (char  [4])uVar15;
  pcStack_130 = pcVar17;
  pcStack_128 = (checkpoint_t *)handle;
  pfStack_120 = unaff_R13;
  pcStack_118 = pcVar13;
  pcStack_110 = pcVar18;
  pcStack_108 = (code *)__s1;
  gettimeofday(&tStack_170,(__timezone_ptr_t)0x0);
  psStack_1b8 = (snap_handle *)0x0;
  __s2._M_i = (__int_type)(pfVar20->field_6).seqtree;
  psStack_1b0 = (snap_handle *)0x0;
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109973;
  __s._M_i = (__int_type)malloc(0x430);
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109985;
  memset((void *)__s._M_i,0,0x430);
  pfVar19 = (fdb_kvs_handle *)pfVar20->trie;
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109993;
  fVar9 = fdb_get_kvs_info(pfVar19,&fStack_160);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    pcStack_180 = (checkpoint_t *)(__s2._M_i + 0xc);
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099b1;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar20->kvs_config,*(bool *)((long)&pfVar20->file + 6));
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099c0;
    fVar14 = last_snap_seqnum((storage_t *)pfVar20,"e2ekv_alldocs");
    *(fdb_seqnum_t *)(__s._M_i + 0x410) = fVar14;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099d6;
    fVar14 = last_snap_seqnum((storage_t *)pfVar20,"e2ekv_index1");
    *(fdb_seqnum_t *)(__s._M_i + 0x418) = fVar14;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099ec;
    fVar14 = last_snap_seqnum((storage_t *)pfVar20,"e2ekv_index2");
    *(fdb_seqnum_t *)(__s._M_i + 0x420) = fVar14;
    lVar21 = 0;
    __s1 = (char *)0x8421084210842109;
    handle = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    do {
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a0c;
      iVar11 = rand();
      *(char *)(__s._M_i + lVar21) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar11 % 0x3e];
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0xc);
    *(undefined1 *)(__s._M_i + 0xb) = 0;
    *(undefined4 *)(__s._M_i + 0x400) = (undefined4)fStack_160.doc_count;
    *(undefined2 *)(__s._M_i + 0x40c) = 0;
    *(short *)(__s._M_i + 0x428) = acStack_19c._0_2_;
    pfVar19 = (fdb_kvs_handle *)(pfVar20->kvs_config).custom_cmp;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a74;
    fVar9 = fdb_snapshot_open(pfVar19,&pfStack_198,*(fdb_seqnum_t *)(__s._M_i + 0x410));
    unaff_R13 = (fdb_kvs_handle *)0xc;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109c41;
    pfVar19 = (fdb_kvs_handle *)(pfVar20->kvs_config).custom_cmp_param;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a91;
    fVar9 = fdb_snapshot_open(pfVar19,&pfStack_188,*(fdb_seqnum_t *)(__s._M_i + 0x418));
    handle = pcStack_180->key;
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109c46;
    pfVar19 = (fdb_kvs_handle *)pfVar20->kvs;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ab3;
    fVar9 = fdb_snapshot_open(pfVar19,&pfStack_190,*(fdb_seqnum_t *)(__s._M_i + 0x420));
    if (fVar9 == FDB_RESULT_SUCCESS) {
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ae2;
      fVar9 = fdb_iterator_init(pfStack_188,(fdb_iterator **)&psStack_1a8,(void *)__s2._M_i,0xc,
                                handle,0xc,2);
      if (fVar9 == FDB_RESULT_SUCCESS) {
        pfVar20 = (fdb_kvs_handle *)&pfVar20->file;
        unaff_R13 = (fdb_kvs_handle *)&psStack_1b8;
        do {
          aStack_1d0.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109b4c;
          fVar9 = fdb_iterator_get((fdb_iterator *)psStack_1a8,(fdb_doc **)unaff_R13);
          if (fVar9 == FDB_RESULT_SUCCESS) {
            __s1 = (char *)psStack_1b8->snap_tag_idx;
            aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109b68;
            iVar11 = strcmp(__s1,(char *)__s2._M_i);
            if (iVar11 < 0) {
LAB_00109c29:
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c37;
              create_checkpoint_cold_5();
            }
            else {
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109b7b;
              iVar11 = strcmp(__s1,handle);
              if (0 < iVar11) goto LAB_00109c29;
            }
            aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109ba4;
            fVar9 = fdb_get_kv(pfStack_198,(void *)psStack_1b8->seqnum,
                               (size_t)(psStack_1b8->avl_id).right,&psStack_1b0,
                               (size_t *)&psStack_178);
            if (fVar9 == FDB_RESULT_SUCCESS) {
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109bbd;
              iVar11 = strcmp((char *)(psStack_1b0 + 0x10),(char *)pfVar20);
              if (iVar11 == 0) {
                *(int *)(__s._M_i + 0x404) = *(int *)(__s._M_i + 0x404) + 1;
                aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)0x109bd6;
                pfVar19 = pfStack_190;
                fVar9 = fdb_get(pfStack_190,(fdb_doc *)psStack_1b8);
                if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109c50;
                *(int *)(__s._M_i + 0x408) =
                     *(int *)(__s._M_i + 0x408) + *(int *)psStack_1b8->seqnum;
              }
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109bf5;
              free(psStack_1b0);
              psStack_1b0 = (snap_handle *)0x0;
            }
            aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109c08;
            fdb_doc_free((fdb_doc *)psStack_1b8);
            psStack_1b8 = (snap_handle *)0x0;
          }
          aStack_1d0.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109c1b;
          fVar9 = fdb_iterator_next((fdb_iterator *)psStack_1a8);
        } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
      }
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109af0;
      fdb_doc_free((fdb_doc *)psStack_1b8);
      psStack_1b8 = (snap_handle *)0x0;
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b03;
      fdb_iterator_close((fdb_iterator *)psStack_1a8);
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b0d;
      fdb_kvs_close(pfStack_198);
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b17;
      fdb_kvs_close(pfStack_188);
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b21;
      fdb_kvs_close(pfStack_190);
      return;
    }
  }
  else {
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c41;
    create_checkpoint_cold_1();
LAB_00109c41:
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c46;
    create_checkpoint_cold_2();
LAB_00109c46:
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c4b;
    create_checkpoint_cold_3();
  }
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c50;
  create_checkpoint_cold_4();
LAB_00109c50:
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)end_checkpoint;
  create_checkpoint_cold_6();
  pcStack_208 = (checkpoint_t *)0x109c6d;
  aStack_1e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s._M_i;
  pfStack_1d8 = pfVar20;
  aStack_1d0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s2._M_i;
  gettimeofday((timeval *)(auStack_1f8 + 8),(__timezone_ptr_t)0x0);
  doc_00 = (list *)auStack_1f8;
  auStack_1f8._0_8_ = (fdb_doc *)0x0;
  pcStack_208 = (checkpoint_t *)0x109c86;
  pcVar13 = create_checkpoint((storage_t *)pfVar19,6);
  pcStack_208 = (checkpoint_t *)0x109c91;
  sVar12 = strlen(pcVar13->key);
  pcStack_208 = (checkpoint_t *)0x109caf;
  fdb_doc_create((fdb_doc **)doc_00,pcVar13,sVar12,(void *)0x0,0,pcVar13,0x430);
  pcStack_208 = (checkpoint_t *)0x109cc6;
  save_tx((storage_t *)pfVar19,*(void **)(auStack_1f8._0_8_ + 0x20),*(size_t *)auStack_1f8._0_8_,6);
  pfVar20 = (fdb_kvs_handle *)pfVar19->op_stats;
  pcStack_208 = (checkpoint_t *)0x109cd3;
  fVar9 = fdb_end_transaction((fdb_file_handle *)pfVar20,
                              *(fdb_commit_opt_t *)((long)&pfVar19->file + 6));
  if (fVar9 == FDB_RESULT_SUCCESS) {
    pfVar20 = (fdb_kvs_handle *)pfVar19->trie;
    pcStack_208 = (checkpoint_t *)0x109ce5;
    fVar9 = fdb_set(pfVar20,(fdb_doc *)auStack_1f8._0_8_);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      pcStack_208 = (checkpoint_t *)0x109cf1;
      free(pcVar13);
      pcStack_208 = (checkpoint_t *)0x109cfb;
      fdb_doc_free((fdb_doc *)auStack_1f8._0_8_);
      return;
    }
  }
  else {
    pcStack_208 = (checkpoint_t *)0x109d0a;
    end_checkpoint_cold_1();
  }
  pcStack_208 = (checkpoint_t *)e2e_fdb_cancel_checkpoint;
  end_checkpoint_cold_2();
  plStack_370 = (list *)0x109d28;
  pfStack_210 = pfVar19;
  pcStack_208 = pcVar13;
  gettimeofday(&tStack_358,(__timezone_ptr_t)0x0);
  pfStack_360 = (fdb_doc *)0x0;
  pfVar19 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)&pfVar20->trie)->super___atomic_base<unsigned_long>)._M_i;
  pcVar17 = (checkpoint_t *)auStack_348;
  plStack_370 = (list *)0x109d3f;
  fVar9 = fdb_get_kvs_info(pfVar19,(fdb_kvs_info *)pcVar17);
  if (fVar9 == FDB_RESULT_SUCCESS) {
    pfVar19 = (fdb_kvs_handle *)&pfStack_360;
    pcVar17 = (checkpoint_t *)0x0;
    plStack_370 = (list *)0x109d65;
    fVar9 = fdb_doc_create((fdb_doc **)pfVar19,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109e64;
    pfStack_360->seqnum = auStack_348._8_8_;
    plStack_370 = (list *)0x109d84;
    fdb_get_byseq((fdb_kvs_handle *)
                  (((atomic<unsigned_long> *)&pfVar20->trie)->super___atomic_base<unsigned_long>).
                  _M_i,pfStack_360);
    pcVar13 = (checkpoint_t *)pfStack_360->body;
    if (pcVar13->type != 5) {
      plStack_370 = (list *)0x109da4;
      e2e_fdb_cancel_checkpoint_cold_3();
    }
    pfVar19 = (fdb_kvs_handle *)&(pfVar20->kvs_config).custom_cmp;
    pcVar17 = (checkpoint_t *)pcVar13->seqnum_all;
    plStack_370 = (list *)0x109db4;
    fVar9 = fdb_rollback((fdb_kvs_handle **)pfVar19,(fdb_seqnum_t)pcVar17);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109e69;
    pfVar19 = (fdb_kvs_handle *)&(pfVar20->kvs_config).custom_cmp_param;
    pcVar17 = (checkpoint_t *)pcVar13->seqnum_idx1;
    plStack_370 = (list *)0x109dcc;
    fVar9 = fdb_rollback((fdb_kvs_handle **)pfVar19,(fdb_seqnum_t)pcVar17);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109e6e;
    pfVar19 = (fdb_kvs_handle *)&pfVar20->kvs;
    pcVar17 = (checkpoint_t *)pcVar13->seqnum_idx2;
    plStack_370 = (list *)0x109de4;
    fVar9 = fdb_rollback((fdb_kvs_handle **)pfVar19,(fdb_seqnum_t)pcVar17);
    if (fVar9 != FDB_RESULT_SUCCESS) goto LAB_00109e73;
    plStack_370 = (list *)0x109dfd;
    pcVar17 = pcVar13;
    memcpy(pfVar20->staletree,pcVar13,0x430);
    pfVar19 = (fdb_kvs_handle *)
              (((atomic<unsigned_long> *)&pfVar20->op_stats)->super___atomic_base<unsigned_long>).
              _M_i;
    plStack_370 = (list *)0x109e06;
    fVar9 = fdb_abort_transaction((fdb_file_handle *)pfVar19);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      plStack_370 = (list *)0x109e27;
      sprintf(auStack_348 + 0x30,"revert to checkpoint[seqno:%lu]\n",pcVar13->seqnum_all);
      pcVar18 = "%s PASSED\n";
      if (e2e_fdb_cancel_checkpoint::__test_pass != '\0') {
        pcVar18 = "%s FAILED\n";
      }
      plStack_370 = (list *)0x109e54;
      fprintf(_stderr,pcVar18,auStack_348 + 0x30);
      return;
    }
  }
  else {
    plStack_370 = (list *)0x109e64;
    e2e_fdb_cancel_checkpoint_cold_1();
LAB_00109e64:
    plStack_370 = (list *)0x109e69;
    e2e_fdb_cancel_checkpoint_cold_2();
LAB_00109e69:
    plStack_370 = (list *)0x109e6e;
    e2e_fdb_cancel_checkpoint_cold_4();
LAB_00109e6e:
    plStack_370 = (list *)0x109e73;
    e2e_fdb_cancel_checkpoint_cold_5();
LAB_00109e73:
    plStack_370 = (list *)0x109e78;
    e2e_fdb_cancel_checkpoint_cold_6();
  }
  plStack_370 = (list *)scan;
  e2e_fdb_cancel_checkpoint_cold_7();
  pcStackY_3d8 = (code *)0x109e9a;
  pfStack_388 = pfVar20;
  pcStack_380 = (checkpoint_t *)handle;
  pcStack_378 = pcVar13;
  plStack_370 = doc_00;
  gettimeofday(&tStack_398,(__timezone_ptr_t)0x0);
  pfStack_3c8 = (fdb_doc *)0x0;
  pcStackY_3d8 = (code *)0x109ead;
  gen_index_params(&iStack_3b0);
  if (pcVar17 != (checkpoint_t *)0x0) {
    pcStackY_3d8 = (code *)0x109ec6;
    fVar9 = fdb_snapshot_open((fdb_kvs_handle *)pcVar17,&pfStack_3b8,0xffffffffffffffff);
    if (fVar9 == FDB_RESULT_SUCCESS) goto LAB_00109eec;
    pcStackY_3d8 = (code *)0x109ecf;
    scan_cold_1();
  }
  pfVar20 = (fdb_kvs_handle *)(pfVar19->kvs_config).custom_cmp_param;
  ptr_handle = &pfStack_3b8;
  pcStackY_3d8 = (code *)0x109ee4;
  fVar9 = fdb_snapshot_open(pfVar20,ptr_handle,0xffffffffffffffff);
  if (fVar9 == FDB_RESULT_SUCCESS) {
LAB_00109eec:
    pcStackY_3d8 = (code *)0x109f1a;
    fVar9 = fdb_iterator_init(pfStack_3b8,&pfStack_3c0,&iStack_3b0,0xc,iStack_3b0.max,0xc,0);
    if (fVar9 == FDB_RESULT_SUCCESS) {
      do {
        pcStackY_3d8 = (code *)0x109f50;
        fVar9 = fdb_iterator_get(pfStack_3c0,&pfStack_3c8);
        if (fVar9 == FDB_RESULT_SUCCESS) {
          pcVar18 = (char *)pfStack_3c8->key;
          pcStackY_3d8 = (code *)0x109f68;
          iVar11 = strcmp(pcVar18,iStack_3b0.min);
          if (iVar11 < 0) {
LAB_00109fa2:
            pcStackY_3d8 = (code *)0x109fb0;
            scan_cold_3();
          }
          else {
            pcStackY_3d8 = (code *)0x109f77;
            iVar11 = strcmp(pcVar18,iStack_3b0.max);
            if (0 < iVar11) goto LAB_00109fa2;
          }
          pcStackY_3d8 = (code *)0x109f85;
          fdb_doc_free(pfStack_3c8);
          pfStack_3c8 = (fdb_doc *)0x0;
        }
        pcStackY_3d8 = (code *)0x109f98;
        fVar9 = fdb_iterator_next(pfStack_3c0);
      } while (fVar9 != FDB_RESULT_ITERATOR_FAIL);
    }
    pcStackY_3d8 = (code *)0x109f28;
    fdb_iterator_close(pfStack_3c0);
    return;
  }
  pcStackY_3d8 = last_snap_seqnum;
  scan_cold_2();
  plStackY_440 = (list *)0x109fd7;
  pcStackY_400 = pcVar17;
  pcStackY_3f8 = (checkpoint_t *)handle;
  pfStackY_3f0 = unaff_R13;
  pfStackY_3e8 = pfVar19;
  plStackY_3e0 = doc_00;
  pcStackY_3d8 = (code *)__s1;
  gettimeofday(&tStackY_410,(__timezone_ptr_t)0x0);
  fhandle = *(fdb_file_handle **)&pfVar20->kvs_config;
  ppfVar22 = &pfStackY_428;
  plStackY_440 = (list *)0x109fe9;
  fVar9 = fdb_get_all_snap_markers
                    (fhandle,(fdb_snapshot_info_t **)ppfVar22,(uint64_t *)&ppfStackY_418);
  pfVar7 = pfStackY_428;
  if (fVar9 == FDB_RESULT_SUCCESS) {
    ppfStackY_430 = ppfStackY_418;
    if (ppfStackY_418 == (fdb_file_handle **)0x0) {
      bVar8 = false;
    }
    else {
      ppfVar22 = (fdb_file_handle **)0x0;
      bVar8 = false;
      do {
        doc_00 = (&pfVar7->handles)[(long)ppfVar22 * 3];
        if (0 < (long)doc_00) {
          pfVar20 = (fdb_kvs_handle *)&(&pfVar7->cmp_func_list)[(long)ppfVar22 * 3]->tail;
          do {
            plStackY_440 = (list *)0x10a037;
            iVar11 = strcmp((char *)pfVar20[-1].bub_ctx.handle,(char *)ptr_handle);
            if (iVar11 == 0) {
              uStackY_420 = *(undefined8 *)&pfVar20->kvs_config;
              bVar8 = true;
              break;
            }
            pfVar20 = (fdb_kvs_handle *)&(pfVar20->kvs_config).custom_cmp_param;
            doc_00 = (list *)((long)&doc_00[-1].tail + 7);
          } while (doc_00 != (list *)0x0);
        }
      } while ((!bVar8) &&
              (ppfVar22 = (fdb_file_handle **)((long)ppfVar22 + 1), ppfVar22 != ppfStackY_430));
    }
    plStackY_440 = (list *)0x10a074;
    ppfVar22 = ppfStackY_430;
    fVar9 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStackY_428,(uint64_t)ppfStackY_430);
    fhandle = pfStackY_428;
    if (fVar9 == FDB_RESULT_SUCCESS) {
      if (bVar8) {
        return;
      }
      goto LAB_0010a09c;
    }
  }
  else {
    plStackY_440 = (list *)0x10a097;
    last_snap_seqnum();
  }
  plStackY_440 = (list *)0x10a09c;
  last_snap_seqnum();
LAB_0010a09c:
  plStackY_440 = (list *)print_n_markers;
  last_snap_seqnum();
  ppfStackY_450 = ptr_handle;
  pfStackY_448 = pfVar20;
  plStackY_440 = doc_00;
  fdb_get_all_snap_markers((fdb_file_handle *)fhandle->root,&pfStackY_460,&uStackY_458);
  if (ppfVar22 != (fdb_file_handle **)0x0) {
    lVar21 = 0x10;
    do {
      printf("marker:  %lu\n",*(undefined8 *)(*(long *)((long)&pfStackY_460->marker + lVar21) + 8));
      lVar21 = lVar21 + 0x18;
      ppfVar22 = (fdb_file_handle **)((long)ppfVar22 + -1);
    } while (ppfVar22 != (fdb_file_handle **)0x0);
  }
  return;
}

Assistant:

void e2e_fdb_set_person(storage_t *st, person_t *p){

    TEST_INIT();
    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    strcpy(p->keyspace, st->keyspace);
    fdb_doc_create(&doc, p->key, strlen(p->key),
                   NULL, 0, (void *)p, sizeof(person_t));
    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_set(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_set_kv(st->index1, p->name, strlen(p->name), doc->key, doc->keylen);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_set_kv(st->index2, p->name, strlen(p->name), (void *)&p->age,
                        sizeof(int));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, SET_PERSON);

    if(!existed){  // new doc
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed++;
            st->v_chk->sum_age_indexed+=p->age;
            free(doc->body);
            doc->body = NULL;
            if (st->verify_set) {
                status = fdb_get(st->all_docs, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
            }
        }
        st->v_chk->ndocs += 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}